

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O3

void cpu_x86_update_dr7_x86_64(CPUX86State *env,uint32_t new_dr7)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  byte bVar8;
  byte bVar9;
  long lVar10;
  ulong uVar7;
  
  uVar6 = new_dr7 | 0x400;
  uVar7 = (ulong)uVar6;
  if ((env->dr[7] ^ uVar7) < 0x100) {
    uVar3 = (uint)env->dr[7];
    uVar4 = (new_dr7 * 2 | new_dr7) ^ (uVar3 * 2 | uVar3);
    bVar8 = 0;
    lVar10 = 0;
    do {
      if (((uVar4 >> (bVar8 & 0x1f) & 2) != 0) &&
         ((uVar6 & ((uint)(1L << (bVar8 & 0x3f)) | (uint)(2L << (bVar8 & 0x3f)))) == 0)) {
        hw_breakpoint_remove(env,(int)lVar10);
      }
      lVar10 = lVar10 + 1;
      bVar8 = bVar8 + 2;
    } while (lVar10 != 4);
    env->dr[7] = uVar7;
    bVar8 = 0;
    bVar9 = 0x10;
    lVar10 = 0;
    uVar1 = 0;
    uVar3 = 0;
    do {
      if (((uVar4 >> (bVar8 & 0x1f) & 2) == 0) ||
         ((uVar6 & ((uint)(1L << (bVar8 & 0x3f)) | (uint)(2L << (bVar8 & 0x3f)))) == 0)) {
        if (((uVar6 >> (bVar9 & 0x3f) & 3) == 2) &&
           (uVar2 = uVar3 | 0x1000000, uVar3 = uVar1,
           (uVar6 & ((uint)(1L << (bVar8 & 0x3f)) | (uint)(2L << (bVar8 & 0x3f)))) != 0)) {
          uVar3 = uVar2;
          uVar1 = uVar2;
        }
      }
      else {
        uVar1 = hw_breakpoint_insert(env,(int)lVar10);
        uVar3 = uVar3 | uVar1;
        uVar1 = uVar3;
      }
      lVar10 = lVar10 + 1;
      bVar8 = bVar8 + 2;
      bVar9 = bVar9 + 4;
    } while (lVar10 != 4);
  }
  else {
    iVar5 = 0;
    do {
      hw_breakpoint_remove(env,iVar5);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 4);
    env->dr[7] = uVar7;
    iVar5 = 0;
    uVar3 = 0;
    do {
      uVar6 = hw_breakpoint_insert(env,iVar5);
      uVar3 = uVar3 | uVar6;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 4);
  }
  env->hflags = env->hflags & 0xfeffffff | uVar3;
  return;
}

Assistant:

void cpu_x86_update_dr7(CPUX86State *env, uint32_t new_dr7)
{
    target_ulong old_dr7 = env->dr[7];
    int iobpt = 0;
    int i;

    new_dr7 |= DR7_FIXED_1;

    /* If nothing is changing except the global/local enable bits,
       then we can make the change more efficient.  */
    if (((old_dr7 ^ new_dr7) & ~0xff) == 0) {
        /* Fold the global and local enable bits together into the
           global fields, then xor to show which registers have
           changed collective enable state.  */
        int mod = ((old_dr7 | old_dr7 * 2) ^ (new_dr7 | new_dr7 * 2)) & 0xff;

        for (i = 0; i < DR7_MAX_BP; i++) {
            if ((mod & (2 << i * 2)) && !hw_breakpoint_enabled(new_dr7, i)) {
                hw_breakpoint_remove(env, i);
            }
        }
        env->dr[7] = new_dr7;
        for (i = 0; i < DR7_MAX_BP; i++) {
            if (mod & (2 << i * 2) && hw_breakpoint_enabled(new_dr7, i)) {
                iobpt |= hw_breakpoint_insert(env, i);
            } else if (hw_breakpoint_type(new_dr7, i) == DR7_TYPE_IO_RW
                       && hw_breakpoint_enabled(new_dr7, i)) {
                iobpt |= HF_IOBPT_MASK;
            }
        }
    } else {
        for (i = 0; i < DR7_MAX_BP; i++) {
            hw_breakpoint_remove(env, i);
        }
        env->dr[7] = new_dr7;
        for (i = 0; i < DR7_MAX_BP; i++) {
            iobpt |= hw_breakpoint_insert(env, i);
        }
    }

    env->hflags = (env->hflags & ~HF_IOBPT_MASK) | iobpt;
}